

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::LoadNextGroup
          (BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  char cVar1;
  uint8_t uVar2;
  data_ptr_t pdVar3;
  undefined8 uVar4;
  unsigned_long uVar5;
  string *msg;
  long in_RDI;
  string *in_stack_ffffffffffffff58;
  InternalException *in_stack_ffffffffffffff60;
  allocator *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  bitpacking_metadata_t in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  undefined8 local_18;
  bitpacking_metadata_t local_10;
  
  *(undefined8 *)(in_RDI + 0x8068) = 0;
  local_10 = DecodeMeta((bitpacking_metadata_encoded_t *)in_stack_ffffffffffffff58);
  *(bitpacking_metadata_t *)(in_RDI + 0x8028) = local_10;
  *(long *)(in_RDI + 0x8078) = *(long *)(in_RDI + 0x8078) + -4;
  local_18 = *(undefined8 *)(in_RDI + 0x8028);
  pdVar3 = GetPtr((BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)
                  CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                  in_stack_ffffffffffffff70);
  *(data_ptr_t *)(in_RDI + 0x8070) = pdVar3;
  if (*(char *)(in_RDI + 0x8028) == '\x02') {
    *(undefined8 *)(in_RDI + 0x8048) = **(undefined8 **)(in_RDI + 0x8070);
    *(undefined8 *)(in_RDI + 0x8050) = (*(undefined8 **)(in_RDI + 0x8070))[1];
    *(long *)(in_RDI + 0x8070) = *(long *)(in_RDI + 0x8070) + 0x10;
  }
  else {
    if (2 < (byte)(*(char *)(in_RDI + 0x8028) - 3U)) {
      local_4d = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_38,"Invalid bitpacking mode",&local_39);
      InternalException::InternalException(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_4d = 0;
      __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
    }
    *(undefined8 *)(in_RDI + 0x8038) = **(undefined8 **)(in_RDI + 0x8070);
    *(undefined8 *)(in_RDI + 0x8040) = (*(undefined8 **)(in_RDI + 0x8070))[1];
    *(long *)(in_RDI + 0x8070) = *(long *)(in_RDI + 0x8070) + 0x10;
  }
  cVar1 = *(char *)(in_RDI + 0x8028);
  if (cVar1 != '\x02') {
    if (cVar1 == '\x03') {
      *(undefined8 *)(in_RDI + 0x8048) = **(undefined8 **)(in_RDI + 0x8070);
      *(undefined8 *)(in_RDI + 0x8050) = (*(undefined8 **)(in_RDI + 0x8070))[1];
      *(long *)(in_RDI + 0x8070) = *(long *)(in_RDI + 0x8070) + 0x10;
    }
    else {
      if (1 < (byte)(cVar1 - 4U)) {
        msg = (string *)__cxa_allocate_exception(0x10);
        this_00 = &local_71;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_70,"Invalid bitpacking mode",this_00);
        InternalException::InternalException((InternalException *)this_00,msg);
        __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
      }
      uVar2 = uhugeint_t::operator_cast_to_unsigned_char((uhugeint_t *)0xaa5dcb);
      *(uint8_t *)(in_RDI + 0x8030) = uVar2;
      uVar5 = MaxValue<unsigned_long>(0x10,1);
      *(unsigned_long *)(in_RDI + 0x8070) = uVar5 + *(long *)(in_RDI + 0x8070);
    }
  }
  if (*(char *)(in_RDI + 0x8028) == '\x04') {
    *(undefined8 *)(in_RDI + 0x8058) = **(undefined8 **)(in_RDI + 0x8070);
    *(undefined8 *)(in_RDI + 0x8060) = (*(undefined8 **)(in_RDI + 0x8070))[1];
    *(long *)(in_RDI + 0x8070) = *(long *)(in_RDI + 0x8070) + 0x10;
  }
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}